

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdCloneHandle(void *source,void **handle)

{
  void *pvVar1;
  undefined8 *in_RSI;
  long in_RDI;
  CfdException *except;
  void *temp_handle;
  int result;
  CfdCapiManager *in_stack_00000040;
  bool in_stack_00000057;
  CfdCapiManager *in_stack_00000058;
  undefined4 local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else {
    cfd::Initialize();
    pvVar1 = cfd::capi::CfdCapiManager::CreateHandle(in_stack_00000058,in_stack_00000057);
    if (in_RDI != 0) {
      cfd::capi::CfdCapiManager::CopyHandle(in_stack_00000040,source,handle,result._3_1_);
    }
    *in_RSI = pvVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CfdCloneHandle(void* source, void** handle) {
  int result = kCfdUnknownError;
  void* temp_handle = nullptr;
  try {
    if (handle == nullptr) return kCfdIllegalArgumentError;
    cfd::Initialize();
    temp_handle = cfd::capi::capi_instance.CreateHandle(true);

    if (source != nullptr) {
      cfd::capi::capi_instance.CopyHandle(source, temp_handle);
    }
    *handle = temp_handle;
    return kCfdSuccess;
  } catch (const CfdException& except) {
    result = except.GetErrorCode();
  } catch (...) {
    // do nothing
  }
  CfdFreeHandle(temp_handle);
  return result;
}